

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O0

void CheckIFrame(TidyDocImpl *doc,Node *node)

{
  Bool BVar1;
  AttVal *av_00;
  AttVal *av;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  BVar1 = Level1_Enabled(doc);
  if (BVar1 != no) {
    av_00 = prvTidyAttrGetById(node,TidyAttr_SRC);
    BVar1 = hasValue(av_00);
    if ((BVar1 != no) && (BVar1 = IsValidSrcExtension(av_00->value), BVar1 == no)) {
      prvTidyReportAccessError(doc,node,0x2d3);
    }
  }
  return;
}

Assistant:

static void CheckIFrame( TidyDocImpl* doc, Node* node )
{
    if (Level1_Enabled( doc ))
    {
        /* Checks for valid 'SRC' value within the IFRAME element */
        AttVal* av = attrGetSRC( node );
        if ( hasValue(av) )
        {
            if ( !IsValidSrcExtension(av->value) )
                TY_(ReportAccessError)( doc, node, FRAME_SRC_INVALID );
        }
    }
}